

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O2

shared_ptr<Image> runEnhanceStage(Image *previous,Histogram *hist,WaterEffectOptions *options)

{
  Image *this;
  int iVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Image> sVar3;
  shared_ptr<Image> enhanced_hist_img;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Histogram enhanced_hist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((options != (WaterEffectOptions *)0x0) && ((char)in_RCX[1]._M_string_length != '\0')) {
    iVar1 = Histogram::max((Histogram *)options,0);
    iVar1 = (int)((double)iVar1 * 0.1);
    std::make_shared<Image,unsigned_int_const&,unsigned_int_const&>
              ((uint *)previous,(uint *)(hist + 1));
    enhanceContrastLinearly
              ((Image *)hist,(Histogram *)options,(Image *)previous->pixels,iVar1,iVar1,0);
    enhanceContrastLinearly
              ((Image *)hist,(Histogram *)options,(Image *)previous->pixels,iVar1,iVar1,1);
    enhanceContrastLinearly
              ((Image *)hist,(Histogram *)options,(Image *)previous->pixels,iVar1,iVar1,2);
    copyChannel((Image *)hist,(Image *)previous->pixels,3);
    _Var2._M_pi = extraout_RDX;
    if (in_RCX[1].field_2._M_local_buf[0] == '\x01') {
      this = (Image *)previous->pixels;
      std::operator+(&local_88,"output/",in_RCX);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &enhanced_hist,&local_88,"_enhanced.png");
      Image::toPNG(this,(string *)&enhanced_hist);
      std::__cxx11::string::~string((string *)&enhanced_hist);
      std::__cxx11::string::~string((string *)&local_88);
      _Var2._M_pi = extraout_RDX_00;
    }
    if (*(char *)((long)&in_RCX[1]._M_string_length + 2) == '\x01') {
      getHistogram(&enhanced_hist,(Image *)previous->pixels);
      Histogram::toImage((Histogram *)&enhanced_hist_img,(uint)&enhanced_hist);
      std::operator+(&local_48,"output/",in_RCX);
      std::operator+(&local_88,&local_48,"_enhanced_histogram.png");
      Image::toPNG(enhanced_hist_img.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   &local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&enhanced_hist_img.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&enhanced_hist.values.super__Vector_base<int,_std::allocator<int>_>);
      _Var2._M_pi = extraout_RDX_01;
    }
    sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
    sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = previous;
    return (shared_ptr<Image>)sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "Contrast enhancement is only possible when histogram stage has been performed.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Image> runEnhanceStage(const Image *previous,
                                       const Histogram *hist,
                                       const WaterEffectOptions *options) {
  // Check if histogram stage has been properly executed.
  if ((!options->histogram) || (hist == nullptr)) {
    throw std::runtime_error("Contrast enhancement is only possible when histogram stage has been performed.");
  }

  // Determine the threshold from the histogram, by taking 10% of the maximum value in the histogram.
  auto threshold = (int) (hist->max(0) * 0.1);

  // Create a new image to store the result
  auto img_enhanced = std::make_shared<Image>(previous->width, previous->height);

  // Enhance the contrast on the color channels
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 0);
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 1);
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 2);

  // Copy over the alpha channel
  copyChannel(previous, img_enhanced.get(), 3);

  // Save the resulting image
  if (options->save_intermediate)
    img_enhanced->toPNG("output/" + options->img_name + "_enhanced.png");

  // Set the previous image to point to the enhanced image for next stages.
  previous = img_enhanced.get();

  // Create and save the enhanced histogram (if enabled).
  if (options->enhance_hist) {
    auto enhanced_hist = getHistogram(img_enhanced.get());
    auto enhanced_hist_img = enhanced_hist.toImage();
    enhanced_hist_img->toPNG("output/" + options->img_name + "_enhanced_histogram.png");
  }

  return img_enhanced;
}